

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char * kj::_::fillLimited<kj::CappedArray<char,17ul>>
                 (char *target,char *limit,CappedArray<char,_17UL> *first)

{
  char *pcVar1;
  char *end;
  char *i;
  CappedArray<char,_17UL> *first_local;
  char *limit_local;
  char *target_local;
  
  end = CappedArray<char,_17UL>::begin(first);
  pcVar1 = CappedArray<char,_17UL>::end(first);
  limit_local = target;
  while( true ) {
    if (end == pcVar1) {
      pcVar1 = fillLimited(limit_local,limit);
      return pcVar1;
    }
    if (limit_local == limit) break;
    *limit_local = *end;
    end = end + 1;
    limit_local = limit_local + 1;
  }
  return limit_local;
}

Assistant:

char* fillLimited(char* __restrict__ target, char* limit, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    if (target == limit) return target;
    *target++ = *i++;
  }
  return fillLimited(target, limit, kj::fwd<Rest>(rest)...);
}